

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# slacking.hpp
# Opt level: O2

void __thiscall slack::_detail::Session::SetBody(Session *this,string *data)

{
  if (this->curl_ != (CURL *)0x0) {
    curl_easy_setopt(this->curl_,0x3c,data->_M_string_length);
    curl_easy_setopt(this->curl_,0x271f,(data->_M_dataplus)._M_p);
    return;
  }
  return;
}

Assistant:

inline
void Session::SetBody(const std::string& data) { 
        if (curl_) {
            curl_easy_setopt(curl_, CURLOPT_POSTFIELDSIZE, data.length());
            curl_easy_setopt(curl_, CURLOPT_POSTFIELDS, data.data());
        }
    }